

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O3

void Dar_LibIncrementScore(int Class,int Out,int Gain)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  
  if (0xdd < (uint)Class) {
    __assert_fail("Class >= 0 && Class < 222",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dar/darLib.c"
                  ,0x27f,"void Dar_LibIncrementScore(int, int, int)");
  }
  if ((-1 < Out) && (Out < s_DarLib->nSubgr[Class])) {
    piVar3 = s_DarLib->pPrios[Class];
    piVar4 = s_DarLib->pPlace[Class];
    if (piVar4[piVar3[(uint)Out]] != Out) {
      __assert_fail("pPlace[pPrios[Out]] == Out",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dar/darLib.c"
                    ,0x281,"void Dar_LibIncrementScore(int, int, int)");
    }
    piVar5 = s_DarLib->pScore[Class];
    piVar5[(uint)Out] = piVar5[(uint)Out] + Gain;
    while( true ) {
      uVar1 = piVar4[(uint)Out];
      if ((int)uVar1 < 1) {
        return;
      }
      iVar2 = piVar3[(ulong)uVar1 - 1];
      if (piVar5[(uint)Out] <= piVar5[iVar2]) break;
      piVar4[(uint)Out] = uVar1 - 1;
      piVar4[iVar2] = piVar4[iVar2] + 1;
      piVar3[piVar4[(uint)Out]] = Out;
      piVar3[piVar4[iVar2]] = iVar2;
    }
    return;
  }
  __assert_fail("Out >= 0 && Out < s_DarLib->nSubgr[Class]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dar/darLib.c"
                ,0x280,"void Dar_LibIncrementScore(int, int, int)");
}

Assistant:

void Dar_LibIncrementScore( int Class, int Out, int Gain )
{
    int * pPrios = s_DarLib->pPrios[Class];  // pPrios[i] = Out
    int * pPlace = s_DarLib->pPlace[Class];  // pPlace[Out] = i
    int * pScore = s_DarLib->pScore[Class];  // score of Out
    int Out2;
    assert( Class >= 0 && Class < 222 );
    assert( Out >= 0 && Out < s_DarLib->nSubgr[Class] );
    assert( pPlace[pPrios[Out]] == Out );
    // increment the score
    pScore[Out] += Gain;
    // move the out in the order 
    while ( pPlace[Out] > 0 && pScore[Out] > pScore[ pPrios[pPlace[Out]-1] ] )
    {
        // get the previous output in the priority list
        Out2 = pPrios[pPlace[Out]-1];
        // swap Out and Out2
        pPlace[Out]--;
        pPlace[Out2]++;
        pPrios[pPlace[Out]] = Out;
        pPrios[pPlace[Out2]] = Out2;
    }
}